

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
FilesystemDirt::ExtractDirtyPath_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FilesystemDirt *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
  *this_00;
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string path;
  iterator child;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FilesystemDirt *local_18;
  FilesystemDirt *this_local;
  
  local_18 = this;
  this_local = (FilesystemDirt *)__return_storage_ptr__;
  if ((this->dirty_ & 1U) != 0) {
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
            ::empty(&this->children_);
    bVar2 = false;
    if (!bVar1) goto LAB_0016136f;
  }
  bVar2 = true;
LAB_0016136f:
  if (bVar2) {
    if ((this->dirty_ & 1U) == 0) {
      bVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
              ::empty(&this->children_);
      if (bVar2) {
        memset(__return_storage_ptr__,0,0x28);
        std::experimental::fundamentals_v1::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__);
      }
      else {
        path.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
             ::begin(&this->children_);
        this_00 = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                   *)((long)&path.field_2 + 8);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                 ::operator->(this_00);
        std::operator+(&local_98,"/",&ppVar3->first);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                 ::operator->(this_00);
        ExtractDirtyPath_abi_cxx11_(&local_c0,&ppVar3->second);
        __rhs = std::experimental::fundamentals_v1::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_c0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,&local_98,__rhs);
        std::experimental::fundamentals_v1::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_c0);
        std::__cxx11::string::~string((string *)&local_98);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                               *)((long)&path.field_2 + 8));
        if (((ppVar3->second).dirty_ & 1U) == 0) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
                                 *)((long)&path.field_2 + 8));
          bVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
                  ::empty(&(ppVar3->second).children_);
          if (bVar2) {
            std::
            map<std::__cxx11::string,FilesystemDirt,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
            ::erase_abi_cxx11_((map<std::__cxx11::string,FilesystemDirt,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
                                *)&this->children_,(iterator)path.field_2._8_8_);
          }
        }
        std::experimental::fundamentals_v1::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    else {
      this->dirty_ = false;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"",&local_39);
      std::experimental::fundamentals_v1::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("(!dirty_ || children_.empty()) && \"Dirtying should always remove children\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/filesystem_dirt.cc"
                ,0x24,"std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath()")
  ;
}

Assistant:

std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath() {
  assert((!dirty_ || children_.empty()) &&
         "Dirtying should always remove children");
  if (dirty_) {
    // End of search: path is dirty. Return "", so that the pathname
    // components leading up to it can be prepended.
    dirty_ = false;
    return std::string("");
  } else if (!children_.empty()) {
    // Get child that is dirty and prepend the pathname compoment. Reap
    // the child in case its dirty paths are exhausted.
    auto child = children_.begin();
    std::string path("/" + child->first + *child->second.ExtractDirtyPath());
    if (!child->second.dirty_ && child->second.children_.empty())
      children_.erase(child);
    return path;
  } else {
    // There are no dirty paths.
    return {};
  }
}